

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O1

int nni_plat_file_lock(char *path,nni_plat_flock *lk)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  iVar1 = open(path,0x42,0x180);
  if (-1 < iVar1) {
    iVar4 = 0;
    iVar2 = lockf(iVar1,2,0);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      close(iVar1);
      iVar4 = 4;
      if (iVar2 != 0xb) goto LAB_0013bbbc;
    }
    else {
      lk->fd = iVar1;
    }
    return iVar4;
  }
  piVar3 = __errno_location();
  iVar2 = *piVar3;
LAB_0013bbbc:
  iVar1 = nni_plat_errno(iVar2);
  return iVar1;
}

Assistant:

int
nni_plat_file_lock(const char *path, nni_plat_flock *lk)
{
	int fd;
	int rv;
	if ((fd = open(path, O_RDWR | O_CREAT, S_IRUSR | S_IWUSR)) < 0) {
		return (nni_plat_errno(errno));
	}
#ifdef NNG_HAVE_LOCKF
	rv = lockf(fd, F_TLOCK, 0);
#elif defined NNG_HAVE_FLOCK
	rv = flock(fd, LOCK_EX | LOCK_NB);
#else
	// We don't have locking support.  This means you live dangerously.
	// For example, ZeroTier cannot be sure that nothing else is using
	// the same configuration file.  If you're here, its probably an
	// embedded scenario, and we can live with it.
	rv = 0;
#endif
	if (rv < 0) {
		int rv = errno;
		close(fd);
		if (rv == EAGAIN) {
			return (NNG_EBUSY);
		}
		return (nni_plat_errno(rv));
	}
	lk->fd = fd;
	return (0);
}